

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_io.cpp
# Opt level: O0

void ucnv_getAliases_63(char *alias,char **aliases,UErrorCode *pErrorCode)

{
  UErrorCode *pErrorCode_local;
  char **aliases_local;
  char *alias_local;
  
  ucnv_io_getAliases(alias,0,aliases,pErrorCode);
  return;
}

Assistant:

U_CAPI void U_EXPORT2
ucnv_getAliases(const char *alias, const char **aliases, UErrorCode *pErrorCode)
{
    ucnv_io_getAliases(alias, 0, aliases, pErrorCode);
}